

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr)

{
  REF_CAVITY pRVar1;
  REF_INT *pRVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT face;
  REF_INT seg;
  REF_CAVITY ref_cavity;
  REF_CAVITY *ref_cavity_ptr_local;
  
  pRVar1 = (REF_CAVITY)malloc(0x78);
  *ref_cavity_ptr = pRVar1;
  if (*ref_cavity_ptr == (REF_CAVITY)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x26,
           "ref_cavity_create","malloc *ref_cavity_ptr of REF_CAVITY_STRUCT NULL");
    ref_cavity_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_cavity_ptr;
    pRVar1->state = REF_CAVITY_UNKNOWN;
    pRVar1->ref_grid = (REF_GRID)0x0;
    pRVar1->node = -1;
    pRVar1->surf_node = -1;
    pRVar1->nseg = 0;
    pRVar1->maxseg = 10;
    if (pRVar1->maxseg * 3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x33
             ,"ref_cavity_create","malloc ref_cavity->s2n of REF_INT negative");
      ref_cavity_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)(pRVar1->maxseg * 3) << 2);
      pRVar1->s2n = pRVar2;
      if (pRVar1->s2n == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x33,"ref_cavity_create","malloc ref_cavity->s2n of REF_INT NULL");
        ref_cavity_ptr_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss = 0;
            SBORROW4(ref_private_macro_code_rss,pRVar1->maxseg * 3) !=
            ref_private_macro_code_rss + pRVar1->maxseg * -3 < 0;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          pRVar1->s2n[ref_private_macro_code_rss] = 0;
        }
        for (ref_malloc_init_i = 0; ref_malloc_init_i < pRVar1->maxseg;
            ref_malloc_init_i = ref_malloc_init_i + 1) {
          pRVar1->s2n[ref_malloc_init_i * 3] = -1;
          pRVar1->s2n[ref_malloc_init_i * 3 + 1] = ref_malloc_init_i + 1;
        }
        pRVar1->s2n[(pRVar1->maxseg + -1) * 3 + 1] = -1;
        pRVar1->blankseg = 0;
        pRVar1->nface = 0;
        pRVar1->maxface = 10;
        if (pRVar1->maxface * 3 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x3f,"ref_cavity_create","malloc ref_cavity->f2n of REF_INT negative");
          ref_cavity_ptr_local._4_4_ = 1;
        }
        else {
          pRVar2 = (REF_INT *)malloc((long)(pRVar1->maxface * 3) << 2);
          pRVar1->f2n = pRVar2;
          if (pRVar1->f2n == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x3f,"ref_cavity_create","malloc ref_cavity->f2n of REF_INT NULL");
            ref_cavity_ptr_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0;
                SBORROW4(ref_private_macro_code_rss_1,pRVar1->maxface * 3) !=
                ref_private_macro_code_rss_1 + pRVar1->maxface * -3 < 0;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              pRVar1->f2n[ref_private_macro_code_rss_1] = 0;
            }
            for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < pRVar1->maxface;
                ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
              pRVar1->f2n[ref_malloc_init_i_1 * 3] = -1;
              pRVar1->f2n[ref_malloc_init_i_1 * 3 + 1] = ref_malloc_init_i_1 + 1;
            }
            pRVar1->f2n[(pRVar1->maxface + -1) * 3 + 1] = -1;
            pRVar1->blankface = 0;
            ref_cavity_ptr_local._4_4_ = ref_list_create(&pRVar1->tri_list);
            if (ref_cavity_ptr_local._4_4_ == 0) {
              ref_cavity_ptr_local._4_4_ = ref_list_create(&pRVar1->tet_list);
              if (ref_cavity_ptr_local._4_4_ == 0) {
                pRVar1->min_normdev = 0.5;
                pRVar1->split_node0 = -1;
                pRVar1->split_node1 = -1;
                pRVar1->collapse_node0 = -1;
                pRVar1->collapse_node1 = -1;
                pRVar1->seg_rm_adds_tet = 0;
                pRVar1->debug = 0;
                ref_cavity_ptr_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x48,"ref_cavity_create",(ulong)ref_cavity_ptr_local._4_4_,"tet list");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x47,"ref_cavity_create",(ulong)ref_cavity_ptr_local._4_4_,"tri list");
            }
          }
        }
      }
    }
  }
  return ref_cavity_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr) {
  REF_CAVITY ref_cavity;
  REF_INT seg, face;

  ref_malloc(*ref_cavity_ptr, 1, REF_CAVITY_STRUCT);
  ref_cavity = (*ref_cavity_ptr);

  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  ref_cavity_grid(ref_cavity) = (REF_GRID)NULL;
  ref_cavity_node(ref_cavity) = REF_EMPTY;
  ref_cavity_surf_node(ref_cavity) = REF_EMPTY;

  ref_cavity_nseg(ref_cavity) = 0;
  ref_cavity_maxseg(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->s2n, ref_cavity_maxseg(ref_cavity) * 3, REF_INT,
                  0);
  for (seg = 0; seg < ref_cavity_maxseg(ref_cavity); seg++) {
    ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
    ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
  }
  ref_cavity_s2n(ref_cavity, 1, ref_cavity_maxseg(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankseg(ref_cavity) = 0;

  ref_cavity_nface(ref_cavity) = 0;
  ref_cavity_maxface(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->f2n, ref_cavity_maxface(ref_cavity) * 3, REF_INT,
                  0);
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  RSS(ref_list_create(&(ref_cavity->tri_list)), "tri list");
  RSS(ref_list_create(&(ref_cavity->tet_list)), "tet list");

  ref_cavity->min_normdev = 0.5;

  ref_cavity->split_node0 = REF_EMPTY;
  ref_cavity->split_node1 = REF_EMPTY;
  ref_cavity->collapse_node0 = REF_EMPTY;
  ref_cavity->collapse_node1 = REF_EMPTY;

  ref_cavity->seg_rm_adds_tet = REF_FALSE;

  ref_cavity->debug = REF_FALSE;

  return REF_SUCCESS;
}